

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int test_sendfile(_func_void_int *setup,uv_fs_cb cb,off_t expected_size)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  undefined1 local_148 [8];
  stat s2;
  stat s1;
  int r;
  int f;
  off_t expected_size_local;
  uv_fs_cb cb_local;
  _func_void_int *setup_local;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  unlink("test_file");
  unlink("test_file2");
  iVar1 = open64("test_file",0x41,0x180);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x480,"f != -1");
    abort();
  }
  if (setup != (_func_void_int *)0x0) {
    (*setup)(iVar1);
  }
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x486,"r == 0");
    abort();
  }
  iVar1 = uv_fs_open(0,&open_req1,"test_file",2,0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x48a,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x48b,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  iVar1 = uv_fs_open(0,&open_req2,"test_file2",0x41,0x180);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x490,"r >= 0");
    abort();
  }
  if (open_req2.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x491,"open_req2.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req2);
  iVar1 = uv_fs_sendfile(::loop,&sendfile_req,open_req2.result & 0xffffffff,
                         open_req1.result & 0xffffffff,0,0x20000,cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x496,"r == 0");
    abort();
  }
  uv_run(::loop,0);
  if (sendfile_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x499,"sendfile_cb_count == 1");
    abort();
  }
  iVar1 = uv_fs_close(0,&close_req,open_req1.result & 0xffffffff);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x49c,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  iVar1 = uv_fs_close(0,&close_req,open_req2.result & 0xffffffff);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x49f,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  iVar1 = stat64("test_file",(stat64 *)(s2.__glibc_reserved + 2));
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4a2,"0 == stat(\"test_file\", &s1)");
    abort();
  }
  iVar1 = stat64("test_file2",(stat64 *)local_148);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4a3,"0 == stat(\"test_file2\", &s2)");
    abort();
  }
  if (s1.st_rdev != s2.st_rdev) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4a4,"s1.st_size == s2.st_size");
    abort();
  }
  if (s2.st_rdev != expected_size) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4a5,"s2.st_size == expected_size");
    abort();
  }
  unlink("test_file");
  unlink("test_file2");
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4ab,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

static int test_sendfile(void (*setup)(int), uv_fs_cb cb, off_t expected_size) {
  int f, r;
  struct stat s1, s2;

  loop = uv_default_loop();

  /* Setup. */
  unlink("test_file");
  unlink("test_file2");

  f = open("test_file", O_WRONLY | O_CREAT, S_IWUSR | S_IRUSR);
  ASSERT(f != -1);

  if (setup != NULL)
    setup(f);

  r = close(f);
  ASSERT(r == 0);

  /* Test starts here. */
  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_open(NULL, &open_req2, "test_file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req2.result >= 0);
  uv_fs_req_cleanup(&open_req2);

  r = uv_fs_sendfile(loop, &sendfile_req, open_req2.result, open_req1.result,
      0, 131072, cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(sendfile_cb_count == 1);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);
  r = uv_fs_close(NULL, &close_req, open_req2.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  ASSERT(0 == stat("test_file", &s1));
  ASSERT(0 == stat("test_file2", &s2));
  ASSERT(s1.st_size == s2.st_size);
  ASSERT(s2.st_size == expected_size);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file2");

  MAKE_VALGRIND_HAPPY();
  return 0;
}